

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

int create_blob_upload_module
              (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handle_data,IOTHUB_CLIENT_CONFIG *config,
              _Bool use_dev_auth)

{
  int iVar1;
  IOTHUB_CLIENT_RESULT IVar2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE pIVar3;
  LOGGER_LOG p_Var4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  char *x509_private_key;
  char *x509_certificate;
  LOGGER_LOG p_Stack_28;
  IOTHUB_CREDENTIAL_TYPE credential_type;
  LOGGER_LOG l;
  int result;
  _Bool use_dev_auth_local;
  IOTHUB_CLIENT_CONFIG *config_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handle_data_local;
  
  l._7_1_ = use_dev_auth;
  _result = config;
  config_local = (IOTHUB_CLIENT_CONFIG *)handle_data;
  pIVar3 = IoTHubClient_LL_UploadToBlob_Create(config,handle_data->authorization_module);
  config_local[7].deviceKey = (char *)pIVar3;
  if (config_local[7].deviceKey == (char *)0x0) {
    p_Stack_28 = xlogging_get_log_function();
    if (p_Stack_28 != (LOGGER_LOG)0x0) {
      (*p_Stack_28)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"create_blob_upload_module",0x18d,1,
                    "unable to IoTHubClientCore_LL_UploadToBlob_Create");
    }
    l._0_4_ = 0x18e;
  }
  else {
    x509_certificate._4_4_ =
         IoTHubClient_Auth_Get_Credential_Type
                   ((IOTHUB_AUTHORIZATION_HANDLE)config_local[7].iotHubName);
    if (((l._7_1_ & 1) == 0) ||
       ((x509_certificate._4_4_ != IOTHUB_CREDENTIAL_TYPE_X509 &&
        (x509_certificate._4_4_ != IOTHUB_CREDENTIAL_TYPE_X509_ECC)))) {
      l._0_4_ = 0;
    }
    else {
      x509_private_key = (char *)0x0;
      l_1 = (LOGGER_LOG)0x0;
      iVar1 = IoTHubClient_Auth_Get_x509_info
                        ((IOTHUB_AUTHORIZATION_HANDLE)config_local[7].iotHubName,&x509_private_key,
                         (char **)&l_1);
      if (iVar1 == 0) {
        IVar2 = IoTHubClient_LL_UploadToBlob_SetOption
                          ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)config_local[7].deviceKey,
                           OPTION_X509_CERT,x509_private_key);
        if (IVar2 == IOTHUB_CLIENT_OK) {
          IVar2 = IoTHubClient_LL_UploadToBlob_SetOption
                            ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)config_local[7].deviceKey,
                             OPTION_X509_PRIVATE_KEY,l_1);
          if (IVar2 == IOTHUB_CLIENT_OK) {
            l._0_4_ = 0;
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"create_blob_upload_module",0x1a8,1,
                        "Failed setting x509 client private key for upload to blob.");
            }
            l._0_4_ = 0x1a9;
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"create_blob_upload_module",0x1a3,1,
                      "Failed setting x509 client certificate for upload to blob.");
          }
          l._0_4_ = 0x1a4;
        }
        free(x509_private_key);
        free(l_1);
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"create_blob_upload_module",0x19c,1,
                    "Failed retrieving x509 client certificate and/or private key for upload to blob."
                   );
        }
        l._0_4_ = 0x19d;
      }
    }
  }
  return (int)l;
}

Assistant:

static int create_blob_upload_module(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handle_data, const IOTHUB_CLIENT_CONFIG* config, bool use_dev_auth)
{
    int result;
    (void)handle_data;
    (void)config;
    (void)use_dev_auth;
#ifndef DONT_USE_UPLOADTOBLOB
    handle_data->uploadToBlobHandle = IoTHubClient_LL_UploadToBlob_Create(config, handle_data->authorization_module);
    if (handle_data->uploadToBlobHandle == NULL)
    {
        LogError("unable to IoTHubClientCore_LL_UploadToBlob_Create");
        result = MU_FAILURE;
    }
    else
    {
        IOTHUB_CREDENTIAL_TYPE credential_type = IoTHubClient_Auth_Get_Credential_Type(handle_data->authorization_module);

        if (use_dev_auth &&
            (credential_type == IOTHUB_CREDENTIAL_TYPE_X509 || credential_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC))
        {
            char* x509_certificate = NULL;
            char* x509_private_key = NULL;

            if (IoTHubClient_Auth_Get_x509_info(handle_data->authorization_module, &x509_certificate, &x509_private_key) != 0)
            {
                LogError("Failed retrieving x509 client certificate and/or private key for upload to blob.");
                result = MU_FAILURE;
            }
            else
            {
                if (IoTHubClient_LL_UploadToBlob_SetOption(handle_data->uploadToBlobHandle, OPTION_X509_CERT, x509_certificate) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed setting x509 client certificate for upload to blob.");
                    result = MU_FAILURE;
                }
                else if (IoTHubClient_LL_UploadToBlob_SetOption(handle_data->uploadToBlobHandle, OPTION_X509_PRIVATE_KEY, x509_private_key) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed setting x509 client private key for upload to blob.");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
                
                free(x509_certificate);
                free(x509_private_key);
            }
        }
        else
        {
            result = 0;
        }
    }
#else
    result = 0;
#endif
    return result;
}